

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::MinimumSizeLabel::minimumSizeHint(MinimumSizeLabel *this)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  QSize QVar6;
  ulong uVar7;
  QArrayData *local_68;
  long local_58;
  QPicture local_50 [24];
  QPixmap local_38 [24];
  
  QLabel::text();
  if (local_58 != 0) {
    cVar1 = '\0';
    goto LAB_00162fdc;
  }
  QLabel::pixmap();
  cVar1 = QPixmap::isNull();
  if (cVar1 == '\0') {
LAB_00162fd0:
    cVar1 = '\0';
  }
  else {
    lVar3 = QLabel::movie();
    if (lVar3 != 0) goto LAB_00162fd0;
    QLabel::picture();
    cVar1 = QPicture::isNull();
    QPicture::~QPicture(local_50);
  }
  QPixmap::~QPixmap(local_38);
LAB_00162fdc:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,8);
    }
  }
  if (cVar1 == '\0') {
    uVar4 = QLabel::sizeHint();
    uVar7 = uVar4 >> 0x20;
    uVar2 = FingerGeometry::width();
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 <= (int)uVar4) {
      uVar5 = uVar4 & 0xffffffff;
    }
    uVar2 = FingerGeometry::height();
    if ((int)(uVar4 >> 0x20) < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    QVar6 = (QSize)(uVar5 | uVar7 << 0x20);
  }
  else {
    QVar6.wd = 0;
    QVar6.ht = 0;
  }
  return QVar6;
}

Assistant:

QSize minimumSizeHint() const override
	{
		if( text().isEmpty() && pixmap( Qt::ReturnByValue ).isNull() && !movie() &&
			picture( Qt::ReturnByValue ).isNull() )
				return QSize( 0, 0 );
		else
		{
			const QSize labelSizeHint = QLabel::sizeHint();

			return QSize( qMax( labelSizeHint.width(), FingerGeometry::width() ),
				qMax( labelSizeHint.height(), FingerGeometry::height() ) );
		}
	}